

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIToolchains.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1600e44::Toolchains::DumpToolchainVariable
          (Toolchains *this,cmMakefile *mf,Value *object,string *lang,ToolchainVariable *variable)

{
  pointer pbVar1;
  bool bVar2;
  Value *pVVar3;
  cmValue value;
  pointer value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string variableName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  Value jsonArray;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  ValueHolder local_98;
  char *local_90;
  string *local_88;
  Value *local_80;
  undefined8 local_78;
  char *local_70;
  size_type local_68;
  pointer local_60;
  Value local_58;
  
  local_98.int_ = 6;
  local_90 = "CMAKE_";
  local_78 = 1;
  local_70 = "_";
  local_60 = (variable->VariableSuffix)._M_dataplus._M_p;
  local_68 = (variable->VariableSuffix)._M_string_length;
  views._M_len = 4;
  views._M_array = (iterator)&local_98;
  local_88 = lang;
  local_80 = object;
  cmCatViews_abi_cxx11_(&local_d8,views);
  if (variable->IsList == true) {
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = cmMakefile::GetDefExpandList((cmMakefile *)this,&local_d8,&local_b8,false);
    if (bVar2) {
      Json::Value::Value((Value *)&local_98,arrayValue);
      pbVar1 = local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        value_00 = local_b8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        do {
          Json::Value::Value(&local_58,value_00);
          Json::Value::append((Value *)&local_98,&local_58);
          Json::Value::~Value(&local_58);
          value_00 = value_00 + 1;
        } while (value_00 != pbVar1);
      }
      pVVar3 = Json::Value::operator[]((Value *)mf,&variable->ObjectKey);
      Json::Value::operator=(pVVar3,(Value *)&local_98);
      Json::Value::~Value((Value *)&local_98);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
  }
  else {
    value = cmMakefile::GetDefinition((cmMakefile *)this,&local_d8);
    if (value.Value != (string *)0x0) {
      Json::Value::Value((Value *)&local_98,value.Value);
      pVVar3 = Json::Value::operator[]((Value *)mf,&variable->ObjectKey);
      Json::Value::operator=(pVVar3,(Value *)&local_98);
      Json::Value::~Value((Value *)&local_98);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Toolchains::DumpToolchainVariable(cmMakefile const* mf,
                                       Json::Value& object,
                                       std::string const& lang,
                                       ToolchainVariable const& variable)
{
  std::string const variableName =
    cmStrCat("CMAKE_", lang, "_", variable.VariableSuffix);

  if (variable.IsList) {
    std::vector<std::string> values;
    if (mf->GetDefExpandList(variableName, values)) {
      Json::Value jsonArray = Json::arrayValue;
      for (std::string const& value : values) {
        jsonArray.append(value);
      }
      object[variable.ObjectKey] = jsonArray;
    }
  } else {
    cmValue def = mf->GetDefinition(variableName);
    if (def) {
      object[variable.ObjectKey] = *def;
    }
  }
}